

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

double megumax::rollout(Position *forwarded_position,UCTNode *expanded_node)

{
  GameState GVar1;
  int iVar2;
  double dVar3;
  undefined8 local_20;
  
  GVar1 = libchess::Position::game_state(forwarded_position);
  if (GVar1 - STALEMATE < 3) {
    local_20 = 0.5;
  }
  else if (GVar1 == IN_PROGRESS) {
    iVar2 = eval(forwarded_position);
    dVar3 = pow(10.0,((double)iVar2 * 0.1 * -1.13) / 400.0);
    local_20 = 1.0 / (dVar3 + 1.0);
  }
  else {
    if (GVar1 != CHECKMATE) {
      abort();
    }
    local_20 = 0.0;
  }
  iVar2 = UCTNode::depth(expanded_node);
  if (0 < iVar2) {
    iVar2 = iVar2 + 1;
    do {
      libchess::Position::unmake_move(forwarded_position);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return 1.0 - local_20;
}

Assistant:

double rollout(Position& forwarded_position, UCTNode* expanded_node) {
    double score;

    switch (forwarded_position.game_state()) {
        case Position::GameState::THREEFOLD_REPETITION:
        case Position::GameState::FIFTY_MOVES:
        case Position::GameState::STALEMATE:
            score = 0.5;
            break;
        case Position::GameState::CHECKMATE:
            score = 0.0;
            break;
        case Position::GameState::IN_PROGRESS:
            score = sigmoid(0.1 * eval(forwarded_position));
            break;
        default:
            abort();
    }

    rewind_position(forwarded_position, expanded_node->depth());
    return 1.0 - score;
}